

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

char * mi_stats_get_json(size_t output_size,char *output_buf)

{
  _Bool _Var1;
  size_t *in_RSI;
  mi_heap_buf_t *in_RDI;
  size_t *unaff_retaddr;
  size_t *in_stack_00000010;
  size_t i_1;
  size_t i;
  mi_stats_t *stats;
  size_t page_faults;
  size_t peak_commit;
  size_t current_commit;
  size_t peak_rss;
  size_t current_rss;
  size_t sys_time;
  size_t user_time;
  size_t elapsed;
  mi_heap_buf_t hbuf;
  size_t in_stack_ffffffffffffff58;
  size_t *psVar2;
  void *in_stack_ffffffffffffff60;
  mi_heap_buf_t *hbuf_00;
  mi_heap_buf_t *in_stack_ffffffffffffff68;
  mi_heap_buf_t *in_stack_ffffffffffffff70;
  ulong local_88;
  mi_heap_buf_t local_78 [2];
  size_t *local_38;
  mi_heap_buf_t *pmVar3;
  size_t *current_commit_00;
  mi_heap_buf_t *hbuf_01;
  size_t *in_stack_fffffffffffffff8;
  
  local_38 = (size_t *)0x0;
  pmVar3 = (mi_heap_buf_t *)0x0;
  current_commit_00 = (size_t *)0x0;
  hbuf_01 = (mi_heap_buf_t *)0x1;
  if ((in_RDI == (mi_heap_buf_t *)0x0) || (in_RSI == (size_t *)0x0)) {
    _Var1 = mi_heap_buf_expand(in_stack_ffffffffffffff68);
    if (!_Var1) {
      return (char *)0x0;
    }
  }
  else {
    psVar2 = in_RSI;
    pmVar3 = in_RDI;
    _mi_memzero(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    local_38 = psVar2;
    hbuf_01 = (mi_heap_buf_t *)((ulong)hbuf_01 & 0xffffffffffffff00);
    in_RSI = local_38;
    in_RDI = pmVar3;
  }
  mi_heap_buf_print(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  mi_heap_buf_print_value(hbuf_01,(char *)current_commit_00,(int64_t)pmVar3);
  mi_heap_buf_print_value(hbuf_01,(char *)current_commit_00,(int64_t)pmVar3);
  mi_heap_buf_print(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  psVar2 = &local_78[0].size;
  hbuf_00 = local_78;
  mi_process_info(unaff_retaddr,in_stack_fffffffffffffff8,(size_t *)in_RDI,in_RSI,(size_t *)hbuf_01,
                  current_commit_00,in_stack_00000010,(size_t *)CONCAT17(i_1._7_1_,(undefined7)i_1))
  ;
  mi_heap_buf_print_size
            (in_RDI,(char *)in_RSI,(size_t)hbuf_01,SUB81((ulong)current_commit_00 >> 0x38,0));
  mi_heap_buf_print_size
            (in_RDI,(char *)in_RSI,(size_t)hbuf_01,SUB81((ulong)current_commit_00 >> 0x38,0));
  mi_heap_buf_print_size
            (in_RDI,(char *)in_RSI,(size_t)hbuf_01,SUB81((ulong)current_commit_00 >> 0x38,0));
  mi_heap_buf_print_size
            (in_RDI,(char *)in_RSI,(size_t)hbuf_01,SUB81((ulong)current_commit_00 >> 0x38,0));
  mi_heap_buf_print_size
            (in_RDI,(char *)in_RSI,(size_t)hbuf_01,SUB81((ulong)current_commit_00 >> 0x38,0));
  mi_heap_buf_print_size
            (in_RDI,(char *)in_RSI,(size_t)hbuf_01,SUB81((ulong)current_commit_00 >> 0x38,0));
  mi_heap_buf_print_size
            (in_RDI,(char *)in_RSI,(size_t)hbuf_01,SUB81((ulong)current_commit_00 >> 0x38,0));
  mi_heap_buf_print_size
            (in_RDI,(char *)in_RSI,(size_t)hbuf_01,SUB81((ulong)current_commit_00 >> 0x38,0));
  mi_heap_buf_print(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  mi_heap_buf_print_count_value(hbuf_01,(char *)current_commit_00,(mi_stat_count_t *)pmVar3);
  mi_heap_buf_print_count_value(hbuf_01,(char *)current_commit_00,(mi_stat_count_t *)pmVar3);
  mi_heap_buf_print_count_value(hbuf_01,(char *)current_commit_00,(mi_stat_count_t *)pmVar3);
  mi_heap_buf_print_count_value(hbuf_01,(char *)current_commit_00,(mi_stat_count_t *)pmVar3);
  mi_heap_buf_print_count_value(hbuf_01,(char *)current_commit_00,(mi_stat_count_t *)pmVar3);
  mi_heap_buf_print_count_value(hbuf_01,(char *)current_commit_00,(mi_stat_count_t *)pmVar3);
  mi_heap_buf_print_count_value(hbuf_01,(char *)current_commit_00,(mi_stat_count_t *)pmVar3);
  mi_heap_buf_print_count_value(hbuf_01,(char *)current_commit_00,(mi_stat_count_t *)pmVar3);
  mi_heap_buf_print_count_value(hbuf_01,(char *)current_commit_00,(mi_stat_count_t *)pmVar3);
  mi_heap_buf_print_count_value(hbuf_01,(char *)current_commit_00,(mi_stat_count_t *)pmVar3);
  mi_heap_buf_print_count_value(hbuf_01,(char *)current_commit_00,(mi_stat_count_t *)pmVar3);
  mi_heap_buf_print_counter_value(hbuf_00,(char *)psVar2,(mi_stat_counter_t *)0x14bf4a0);
  mi_heap_buf_print_counter_value(hbuf_00,(char *)psVar2,(mi_stat_counter_t *)0x14bf4bd);
  mi_heap_buf_print_counter_value(hbuf_00,(char *)psVar2,(mi_stat_counter_t *)0x14bf4da);
  mi_heap_buf_print_counter_value(hbuf_00,(char *)psVar2,(mi_stat_counter_t *)0x14bf4f7);
  mi_heap_buf_print_counter_value(hbuf_00,(char *)psVar2,(mi_stat_counter_t *)0x14bf514);
  mi_heap_buf_print_counter_value(hbuf_00,(char *)psVar2,(mi_stat_counter_t *)0x14bf531);
  mi_heap_buf_print_counter_value(hbuf_00,(char *)psVar2,(mi_stat_counter_t *)0x14bf54e);
  mi_heap_buf_print_counter_value(hbuf_00,(char *)psVar2,(mi_stat_counter_t *)0x14bf56b);
  mi_heap_buf_print_counter_value(hbuf_00,(char *)psVar2,(mi_stat_counter_t *)0x14bf588);
  mi_heap_buf_print_counter_value(hbuf_00,(char *)psVar2,(mi_stat_counter_t *)0x14bf5a5);
  mi_heap_buf_print_counter_value(hbuf_00,(char *)psVar2,(mi_stat_counter_t *)0x14bf5c2);
  mi_heap_buf_print_counter_value(hbuf_00,(char *)psVar2,(mi_stat_counter_t *)0x14bf5df);
  mi_heap_buf_print_counter_value(hbuf_00,(char *)psVar2,(mi_stat_counter_t *)0x14bf5fc);
  mi_heap_buf_print_count_value(hbuf_01,(char *)current_commit_00,(mi_stat_count_t *)pmVar3);
  mi_heap_buf_print_count_value(hbuf_01,(char *)current_commit_00,(mi_stat_count_t *)pmVar3);
  mi_heap_buf_print_count_value(hbuf_01,(char *)current_commit_00,(mi_stat_count_t *)pmVar3);
  mi_heap_buf_print_count_value(hbuf_01,(char *)current_commit_00,(mi_stat_count_t *)pmVar3);
  mi_heap_buf_print_counter_value(hbuf_00,(char *)psVar2,(mi_stat_counter_t *)0x14bf68d);
  mi_heap_buf_print_counter_value(hbuf_00,(char *)psVar2,(mi_stat_counter_t *)0x14bf6aa);
  mi_heap_buf_print_counter_value(hbuf_00,(char *)psVar2,(mi_stat_counter_t *)0x14bf6c7);
  mi_heap_buf_print_counter_value(hbuf_00,(char *)psVar2,(mi_stat_counter_t *)0x14bf6e4);
  mi_heap_buf_print(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  for (local_88 = 0; local_88 < 0x4a; local_88 = local_88 + 1) {
    mi_heap_buf_print_count_bin
              ((mi_heap_buf_t *)peak_commit,(char *)page_faults,(mi_stat_count_t *)stats,i,i_1._7_1_
              );
  }
  mi_heap_buf_print(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  mi_heap_buf_print(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  for (pmVar3 = (mi_heap_buf_t *)0x0; pmVar3 < (mi_heap_buf_t *)0x4a;
      pmVar3 = (mi_heap_buf_t *)((long)&pmVar3->buf + 1)) {
    mi_heap_buf_print_count_bin
              ((mi_heap_buf_t *)peak_commit,(char *)page_faults,(mi_stat_count_t *)stats,i,i_1._7_1_
              );
  }
  mi_heap_buf_print(pmVar3,(char *)in_stack_ffffffffffffff68);
  mi_heap_buf_print(pmVar3,(char *)in_stack_ffffffffffffff68);
  return (char *)local_38;
}

Assistant:

char* mi_stats_get_json(size_t output_size, char* output_buf) mi_attr_noexcept {
  mi_heap_buf_t hbuf = { NULL, 0, 0, true };
  if (output_size > 0 && output_buf != NULL) {
    _mi_memzero(output_buf, output_size);
    hbuf.buf = output_buf;
    hbuf.size = output_size;
    hbuf.can_realloc = false;
  }
  else {
    if (!mi_heap_buf_expand(&hbuf)) return NULL;
  }
  mi_heap_buf_print(&hbuf, "{\n");
  mi_heap_buf_print_value(&hbuf, "version", MI_STAT_VERSION);
  mi_heap_buf_print_value(&hbuf, "mimalloc_version", MI_MALLOC_VERSION);

  // process info
  mi_heap_buf_print(&hbuf, "  \"process\": {\n");
  size_t elapsed;
  size_t user_time;
  size_t sys_time;
  size_t current_rss;
  size_t peak_rss;
  size_t current_commit;
  size_t peak_commit;
  size_t page_faults;
  mi_process_info(&elapsed, &user_time, &sys_time, &current_rss, &peak_rss, &current_commit, &peak_commit, &page_faults);
  mi_heap_buf_print_size(&hbuf, "elapsed_msecs", elapsed, true);
  mi_heap_buf_print_size(&hbuf, "user_msecs", user_time, true);
  mi_heap_buf_print_size(&hbuf, "system_msecs", sys_time, true);
  mi_heap_buf_print_size(&hbuf, "page_faults", page_faults, true);
  mi_heap_buf_print_size(&hbuf, "rss_current", current_rss, true);
  mi_heap_buf_print_size(&hbuf, "rss_peak", peak_rss, true);
  mi_heap_buf_print_size(&hbuf, "commit_current", current_commit, true);
  mi_heap_buf_print_size(&hbuf, "commit_peak", peak_commit, false);
  mi_heap_buf_print(&hbuf, "  },\n");

  // statistics
  mi_stats_t* stats = &_mi_stats_main;
  MI_STAT_FIELDS()

  // size bins
  mi_heap_buf_print(&hbuf, "  \"malloc_bins\": [\n");
  for (size_t i = 0; i <= MI_BIN_HUGE; i++) {
    mi_heap_buf_print_count_bin(&hbuf, "    ", &stats->malloc_bins[i], i, i!=MI_BIN_HUGE);
  }
  mi_heap_buf_print(&hbuf, "  ],\n");
  mi_heap_buf_print(&hbuf, "  \"page_bins\": [\n");
  for (size_t i = 0; i <= MI_BIN_HUGE; i++) {
    mi_heap_buf_print_count_bin(&hbuf, "    ", &stats->page_bins[i], i, i!=MI_BIN_HUGE);
  }
  mi_heap_buf_print(&hbuf, "  ]\n");
  mi_heap_buf_print(&hbuf, "}\n");
  return hbuf.buf;
}